

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_float(char **begin,char *end,float *number)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  byte bVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pbVar2 = (byte *)*begin;
  fVar8 = 1.0;
  if (pbVar2 < end) {
    if (*pbVar2 == 0x2d) {
      pbVar2 = pbVar2 + 1;
      fVar8 = -1.0;
    }
    else if (*pbVar2 == 0x2b) {
      pbVar2 = pbVar2 + 1;
    }
  }
  if (pbVar2 < end) {
    bVar6 = *pbVar2;
    fVar11 = 0.0;
    if (bVar6 == 0x2e) {
      fVar10 = 0.0;
      pbVar4 = pbVar2;
    }
    else {
      if (9 < (byte)(bVar6 - 0x30)) goto LAB_001066e4;
      pcVar5 = end + ~(ulong)pbVar2;
      fVar10 = 0.0;
      do {
        fVar10 = fVar10 * 10.0 + (float)(int)(bVar6 - 0x30);
        pbVar4 = (byte *)end;
        if (pcVar5 == (char *)0x0) break;
        bVar6 = pbVar2[1];
        pbVar4 = pbVar2 + 1;
        pcVar5 = pcVar5 + -1;
        pbVar2 = pbVar4;
      } while ((byte)(bVar6 - 0x30) < 10);
    }
    if ((pbVar4 < end) && (*pbVar4 == 0x2e)) {
      pbVar2 = pbVar4 + 1;
      if ((end <= pbVar2) || (bVar6 = *pbVar2, 9 < (byte)(bVar6 - 0x30))) goto LAB_001066e4;
      pbVar3 = pbVar4 + ((long)end - (long)pbVar4);
      lVar7 = ((long)end - (long)pbVar4) + -2;
      fVar9 = 1.0;
      fVar11 = 0.0;
      do {
        fVar11 = fVar11 * 10.0 + (float)(int)(bVar6 - 0x30);
        fVar9 = fVar9 * 10.0;
        pbVar4 = pbVar3;
        if (lVar7 == 0) break;
        bVar6 = pbVar2[1];
        pbVar4 = pbVar2 + 1;
        lVar7 = lVar7 + -1;
        pbVar2 = pbVar4;
      } while ((byte)(bVar6 - 0x30) < 10);
      fVar11 = fVar11 / fVar9;
    }
    pbVar2 = pbVar4 + 1;
    if ((((pbVar2 < end) && ((*pbVar4 | 0x20) == 0x65)) && (bVar6 = *pbVar2, bVar6 != 0x78)) &&
       (bVar6 != 0x6d)) {
      pbVar4 = pbVar4 + 2;
      if (bVar6 == 0x2b) {
        fVar9 = 1.0;
      }
      else {
        if (bVar6 != 0x2d) {
          pbVar4 = pbVar2;
        }
        fVar9 = *(float *)(&DAT_00129210 + (ulong)(bVar6 == 0x2d) * 4);
      }
      if ((end <= pbVar4) || (bVar6 = *pbVar4, 9 < (byte)(bVar6 - 0x30))) goto LAB_001066e4;
      pcVar5 = end + ~(ulong)pbVar4;
      fVar12 = 0.0;
      do {
        fVar12 = fVar12 * 10.0 + (float)(int)(bVar6 - 0x30);
        pbVar2 = (byte *)end;
        if (pcVar5 == (char *)0x0) break;
        bVar6 = pbVar4[1];
        pbVar2 = pbVar4 + 1;
        pcVar5 = pcVar5 + -1;
        pbVar4 = pbVar2;
      } while ((byte)(bVar6 - 0x30) < 10);
      *begin = (char *)pbVar2;
      fVar8 = fVar8 * (fVar10 + fVar11);
      *number = fVar8;
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        fVar8 = powf(10.0,fVar9 * fVar12);
        fVar8 = fVar8 * *number;
        goto LAB_0010665c;
      }
    }
    else {
      *begin = (char *)pbVar4;
      fVar8 = fVar8 * (fVar10 + fVar11);
LAB_0010665c:
      *number = fVar8;
    }
    bVar1 = ABS(fVar8) <= 3.4028235e+38;
  }
  else {
LAB_001066e4:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static inline bool parse_float(const char** begin, const char* end, float* number)
{
    const char* it = *begin;
    float integer = 0;
    float fraction = 0;
    float exponent = 0;
    int sign = 1;
    int expsign = 1;

    if(it < end && *it == '+')
        ++it;
    else if(it < end && *it == '-') {
        ++it;
        sign = -1;
    }

    if(it >= end || (*it != '.' && !IS_NUM(*it)))
        return false;
    if(IS_NUM(*it)) {
        do {
            integer = 10.f * integer + (*it++ - '0');
        } while(it < end && IS_NUM(*it));
    }

    if(it < end && *it == '.') {
        ++it;
        if(it >= end || !IS_NUM(*it))
            return false;
        float divisor = 1.f;
        do {
            fraction = 10.f * fraction + (*it++ - '0');
            divisor *= 10.f;
        } while(it < end && IS_NUM(*it));
        fraction /= divisor;
    }

    if(it + 1 < end && (it[0] == 'e' || it[0] == 'E') && (it[1] != 'x' && it[1] != 'm')) {
        ++it;
        if(it < end && *it == '+')
            ++it;
        else if(it < end && *it == '-') {
            ++it;
            expsign = -1;
        }

        if(it >= end || !IS_NUM(*it))
            return false;
        do {
            exponent = 10 * exponent + (*it++ - '0');
        } while(it < end && IS_NUM(*it));
    }

    *begin = it;
    *number = sign * (integer + fraction);
    if(exponent)
        *number *= powf(10.f, expsign * exponent);
    return *number >= -FLT_MAX && *number <= FLT_MAX;
}